

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O1

SequenceExprSyntax * __thiscall slang::parsing::Parser::parseSequencePrimary(Parser *this)

{
  Token closeParen_00;
  TokenKind TVar1;
  SequenceExprSyntax *pSVar2;
  SequenceMatchListSyntax *matchList;
  FirstMatchSequenceExprSyntax *pFVar3;
  TimingControlSyntax *event;
  ClockingSequenceExprSyntax *pCVar4;
  EventExpressionSyntax *pEVar5;
  ExpressionSyntax *expr;
  SequenceRepetitionSyntax *repetition;
  SimpleSequenceExprSyntax *pSVar6;
  Token TVar7;
  Token openParen;
  Token closeParen;
  Token local_40;
  
  TVar7 = ParserBase::peek(&this->super_ParserBase);
  TVar1 = TVar7.kind;
  if (TVar1 < EdgeKeyword) {
    if (TVar1 == OpenParenthesis) {
      TVar7 = ParserBase::consume(&this->super_ParserBase);
      pSVar2 = parseSequenceExpr(this,0,false);
      pSVar2 = parseParenthesizedSeqExpr(this,TVar7,pSVar2);
      return pSVar2;
    }
    if (TVar1 == DoubleHash) {
      pSVar2 = parseDelayedSequenceExpr(this,(SequenceExprSyntax *)0x0);
      return pSVar2;
    }
    if (TVar1 == At) {
      event = parseTimingControl(this,true);
      pSVar2 = parseSequenceExpr(this,0,false);
      pCVar4 = slang::syntax::SyntaxFactory::clockingSequenceExpr(&this->factory,event,pSVar2);
      return &pCVar4->super_SequenceExprSyntax;
    }
  }
  else if (TVar1 < NegEdgeKeyword) {
    if (TVar1 == EdgeKeyword) {
LAB_0042f799:
      pEVar5 = parseSignalEvent(this);
      return &pEVar5->super_SequenceExprSyntax;
    }
    if (TVar1 == FirstMatchKeyword) {
      TVar7 = ParserBase::consume(&this->super_ParserBase);
      openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
      pSVar2 = parseSequenceExpr(this,0,false);
      Token::Token(&local_40);
      matchList = parseSequenceMatchList(this,&local_40);
      closeParen_00.info = local_40.info;
      closeParen_00.kind = local_40.kind;
      closeParen_00._2_1_ = local_40._2_1_;
      closeParen_00.numFlags.raw = local_40.numFlags.raw;
      closeParen_00.rawLen = local_40.rawLen;
      pFVar3 = slang::syntax::SyntaxFactory::firstMatchSequenceExpr
                         (&this->factory,TVar7,openParen,pSVar2,matchList,closeParen_00);
      return &pFVar3->super_SequenceExprSyntax;
    }
  }
  else if ((TVar1 == NegEdgeKeyword) || (TVar1 == PosEdgeKeyword)) goto LAB_0042f799;
  expr = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x90,0);
  repetition = parseSequenceRepetition(this);
  pSVar6 = slang::syntax::SyntaxFactory::simpleSequenceExpr(&this->factory,expr,repetition);
  return &pSVar6->super_SequenceExprSyntax;
}

Assistant:

SequenceExprSyntax& Parser::parseSequencePrimary() {
    auto current = peek();
    switch (current.kind) {
        case TokenKind::DoubleHash:
            return parseDelayedSequenceExpr(nullptr);
        case TokenKind::At: {
            auto event = parseTimingControl(/* inAssertion */ true);
            SLANG_ASSERT(event);
            return factory.clockingSequenceExpr(*event,
                                                parseSequenceExpr(0, /* isInProperty */ false));
        }
        case TokenKind::FirstMatchKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& expr = parseSequenceExpr(0, /* isInProperty */ false);

            Token closeParen;
            auto matchList = parseSequenceMatchList(closeParen);
            return factory.firstMatchSequenceExpr(keyword, openParen, expr, matchList, closeParen);
        }
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto& expr = parseSequenceExpr(0, /* isInProperty */ false);
            return parseParenthesizedSeqExpr(openParen, expr);
        }
        case TokenKind::EdgeKeyword:
        case TokenKind::NegEdgeKeyword:
        case TokenKind::PosEdgeKeyword:
            return parseSignalEvent();
        default: {
            auto& expr = parseExpressionOrDist(ExpressionOptions::SequenceExpr);
            auto repetition = parseSequenceRepetition();
            return factory.simpleSequenceExpr(expr, repetition);
        }
    }
}